

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.cpp
# Opt level: O1

wstring * __thiscall
GdlFeatureSetting::FindBasicExtName_abi_cxx11_
          (wstring *__return_storage_ptr__,GdlFeatureSetting *this)

{
  utf16 uVar1;
  pointer pGVar2;
  pointer pwVar3;
  pointer gdl;
  bool bVar4;
  GdlExtName extname;
  GdlObject local_80;
  long *local_58;
  long local_50;
  long local_48 [2];
  utf16 local_38;
  
  gdl = (this->m_vextname).super__Vector_base<GdlExtName,_std::allocator<GdlExtName>_>._M_impl.
        super__Vector_impl_data._M_start;
  pGVar2 = (this->m_vextname).super__Vector_base<GdlExtName,_std::allocator<GdlExtName>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar4 = gdl == pGVar2;
  if (!bVar4) {
    do {
      GdlObject::GdlObject(&local_80,&gdl->super_GdlObject);
      pwVar3 = (gdl->m_stuName)._M_dataplus._M_p;
      local_58 = local_48;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)&local_58,pwVar3,pwVar3 + (gdl->m_stuName)._M_string_length);
      uVar1 = gdl->m_wLanguageID;
      local_38 = uVar1;
      if ((uVar1 == 0x409) || (uVar1 == 0)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::wstring::_M_construct<wchar_t*>
                  ((wstring *)__return_storage_ptr__,local_58,(long)local_58 + local_50 * 4);
      }
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] * 4 + 4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.m_lnf.m_staFile._M_dataplus._M_p != &local_80.m_lnf.m_staFile.field_2) {
        operator_delete(local_80.m_lnf.m_staFile._M_dataplus._M_p,
                        local_80.m_lnf.m_staFile.field_2._M_allocated_capacity + 1);
      }
      if ((uVar1 == 0) || (uVar1 == 0x409)) {
        if (!bVar4) {
          return __return_storage_ptr__;
        }
        break;
      }
      gdl = gdl + 1;
      bVar4 = gdl == pGVar2;
    } while (!bVar4);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  return __return_storage_ptr__;
}

Assistant:

std::wstring GdlFeatureSetting::FindBasicExtName() // find an English or language-neutral label
{
	for (auto const extname: m_vextname)
	{
		if (extname.m_wLanguageID == 1033
				|| extname.m_wLanguageID == 0)
			return extname.m_stuName;
	}
	return std::wstring();
}